

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::Equals<char[24],std::__cxx11::string>
          (Assert *this,char (*expected) [24],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual)

{
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_local;
  char (*expected_local) [24];
  Assert *this_local;
  
  local_20 = actual;
  actual_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)expected;
  expected_local = (char (*) [24])this;
  std::__cxx11::string::string(local_40);
  Equals<char[24],std::__cxx11::string>
            (this,(string *)local_40,(char (*) [24])actual_local,local_20);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void Equals(const T& expected, const U& actual) const
        {
            Equals(std::string(), expected, actual);
        }